

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfDeepImageIO.cpp
# Opt level: O0

void Imf_2_5::loadDeepScanLineImage(string *fileName,Header *hdr,DeepImage *img)

{
  long *plVar1;
  bool bVar2;
  int iVar3;
  Box2i *pBVar4;
  DeepImageLevel *this;
  DeepImageChannel *pDVar5;
  Header *this_00;
  char *__s1;
  long *in_RDX;
  int in_stack_00000124;
  char *in_stack_00000128;
  DeepScanLineInputFile *in_stack_00000130;
  ConstIterator i_2;
  Edit edit;
  ConstIterator i_1;
  DeepFrameBuffer fb;
  DeepImageLevel *level;
  ConstIterator i;
  ChannelList *cl;
  DeepScanLineInputFile in;
  Attribute *in_stack_00000300;
  char *in_stack_00000308;
  Header *in_stack_00000310;
  DeepImageLevel *in_stack_fffffffffffffd38;
  Image *in_stack_fffffffffffffd40;
  Slice *in_stack_fffffffffffffd48;
  Image *in_stack_fffffffffffffd50;
  undefined7 in_stack_fffffffffffffd60;
  undefined1 in_stack_fffffffffffffd67;
  allocator<char> *in_stack_fffffffffffffd70;
  char *in_stack_fffffffffffffd78;
  SampleCountChannel *in_stack_fffffffffffffd80;
  undefined1 local_178 [56];
  iterator local_140;
  iterator local_130;
  int in_stack_ffffffffffffff68;
  int in_stack_ffffffffffffff6c;
  DeepScanLineInputFile *in_stack_ffffffffffffff70;
  allocator<char> local_71;
  string local_70 [8];
  int in_stack_ffffffffffffff98;
  int in_stack_ffffffffffffff9c;
  DeepScanLineInputFile *in_stack_ffffffffffffffa0;
  DeepScanLineInputFile local_28;
  long *local_18;
  
  local_18 = in_RDX;
  std::__cxx11::string::c_str();
  globalThreadCount();
  DeepScanLineInputFile::DeepScanLineInputFile
            (in_stack_00000130,in_stack_00000128,in_stack_00000124);
  DeepScanLineInputFile::header(&local_28);
  Header::channels((Header *)0x1377ac);
  Image::clearChannels(in_stack_fffffffffffffd50);
  ChannelList::begin((ChannelList *)in_stack_fffffffffffffd38);
  while( true ) {
    ChannelList::end((ChannelList *)in_stack_fffffffffffffd38);
    bVar2 = operator!=((ConstIterator *)in_stack_fffffffffffffd40,
                       (ConstIterator *)in_stack_fffffffffffffd38);
    plVar1 = local_18;
    if (!bVar2) break;
    ChannelList::ConstIterator::name((ConstIterator *)0x13786e);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_fffffffffffffd80,in_stack_fffffffffffffd78,in_stack_fffffffffffffd70);
    ChannelList::ConstIterator::channel((ConstIterator *)0x1378b9);
    Image::insertChannel
              (in_stack_fffffffffffffd40,(string *)in_stack_fffffffffffffd38,(Channel *)0x1378e0);
    std::__cxx11::string::~string(local_70);
    std::allocator<char>::~allocator(&local_71);
    ChannelList::ConstIterator::operator++((ConstIterator *)in_stack_fffffffffffffd40);
  }
  DeepScanLineInputFile::header(&local_28);
  pBVar4 = Header::dataWindow((Header *)0x1379a6);
  (**(code **)(*plVar1 + 0x10))(plVar1,pBVar4,0);
  this = (DeepImageLevel *)(**(code **)(*local_18 + 0x18))(local_18,0);
  DeepFrameBuffer::DeepFrameBuffer
            ((DeepFrameBuffer *)CONCAT17(in_stack_fffffffffffffd67,in_stack_fffffffffffffd60));
  DeepImageLevel::sampleCounts(this);
  SampleCountChannel::slice(in_stack_fffffffffffffd80);
  DeepFrameBuffer::insertSampleCountSlice
            ((DeepFrameBuffer *)in_stack_fffffffffffffd50,in_stack_fffffffffffffd48);
  local_130._M_node = (_Base_ptr)DeepImageLevel::begin(in_stack_fffffffffffffd38);
  DeepImageLevel::ConstIterator::ConstIterator
            ((ConstIterator *)in_stack_fffffffffffffd40,(Iterator *)in_stack_fffffffffffffd38);
  while( true ) {
    local_140._M_node = (_Base_ptr)DeepImageLevel::end(in_stack_fffffffffffffd38);
    DeepImageLevel::ConstIterator::ConstIterator
              ((ConstIterator *)in_stack_fffffffffffffd40,(Iterator *)in_stack_fffffffffffffd38);
    bVar2 = operator!=((ConstIterator *)in_stack_fffffffffffffd40,
                       (ConstIterator *)in_stack_fffffffffffffd38);
    if (!bVar2) break;
    DeepImageLevel::ConstIterator::name_abi_cxx11_((ConstIterator *)0x137b09);
    pDVar5 = DeepImageLevel::ConstIterator::channel((ConstIterator *)0x137b20);
    (*(pDVar5->super_ImageChannel)._vptr_ImageChannel[4])(local_178);
    DeepFrameBuffer::insert
              ((DeepFrameBuffer *)in_stack_fffffffffffffd50,(string *)in_stack_fffffffffffffd48,
               (DeepSlice *)in_stack_fffffffffffffd40);
    DeepImageLevel::ConstIterator::operator++((ConstIterator *)in_stack_fffffffffffffd40);
  }
  DeepScanLineInputFile::setFrameBuffer
            ((DeepScanLineInputFile *)fb._map._M_t._M_impl.super__Rb_tree_header._M_header._M_left,
             (DeepFrameBuffer *)fb._map._M_t._M_impl.super__Rb_tree_header._M_header._M_parent);
  DeepImageLevel::sampleCounts(this);
  SampleCountChannel::Edit::Edit
            ((Edit *)in_stack_fffffffffffffd40,(SampleCountChannel *)in_stack_fffffffffffffd38);
  ImageLevel::dataWindow((ImageLevel *)this);
  ImageLevel::dataWindow((ImageLevel *)this);
  DeepScanLineInputFile::readPixelSampleCounts
            (in_stack_ffffffffffffff70,in_stack_ffffffffffffff6c,in_stack_ffffffffffffff68);
  SampleCountChannel::Edit::~Edit((Edit *)0x137c34);
  ImageLevel::dataWindow((ImageLevel *)this);
  ImageLevel::dataWindow((ImageLevel *)this);
  DeepScanLineInputFile::readPixels
            (in_stack_ffffffffffffffa0,in_stack_ffffffffffffff9c,in_stack_ffffffffffffff98);
  DeepScanLineInputFile::header(&local_28);
  Header::begin((Header *)in_stack_fffffffffffffd38);
  while( true ) {
    this_00 = DeepScanLineInputFile::header(&local_28);
    Header::end((Header *)in_stack_fffffffffffffd38);
    bVar2 = operator!=((ConstIterator *)in_stack_fffffffffffffd40,
                       (ConstIterator *)in_stack_fffffffffffffd38);
    if (!bVar2) break;
    __s1 = Header::ConstIterator::name((ConstIterator *)0x137d1c);
    iVar3 = strcmp(__s1,"tiles");
    if (iVar3 != 0) {
      Header::ConstIterator::name((ConstIterator *)0x137d53);
      in_stack_fffffffffffffd40 =
           (Image *)Header::ConstIterator::attribute((ConstIterator *)0x137d67);
      Header::insert(in_stack_00000310,in_stack_00000308,in_stack_00000300);
    }
    Header::ConstIterator::operator++((ConstIterator *)in_stack_fffffffffffffd40);
  }
  DeepFrameBuffer::~DeepFrameBuffer((DeepFrameBuffer *)0x137dcc);
  DeepScanLineInputFile::~DeepScanLineInputFile((DeepScanLineInputFile *)this_00);
  return;
}

Assistant:

void
loadDeepScanLineImage
    (const string &fileName,
     Header &hdr,
     DeepImage &img)
{
    DeepScanLineInputFile in (fileName.c_str());

    const ChannelList &cl = in.header().channels();

    img.clearChannels();

    for (ChannelList::ConstIterator i = cl.begin(); i != cl.end(); ++i)
        img.insertChannel (i.name(), i.channel());

    img.resize (in.header().dataWindow(), ONE_LEVEL, ROUND_DOWN);

    DeepImageLevel &level = img.level();
    DeepFrameBuffer fb;

    fb.insertSampleCountSlice (level.sampleCounts().slice());

    for (DeepImageLevel::ConstIterator i = level.begin(); i != level.end(); ++i)
        fb.insert (i.name(), i.channel().slice());

    in.setFrameBuffer (fb);

    {
        SampleCountChannel::Edit edit (level.sampleCounts());

        in.readPixelSampleCounts
            (level.dataWindow().min.y, level.dataWindow().max.y);
    }

    in.readPixels (level.dataWindow().min.y, level.dataWindow().max.y);

    for (Header::ConstIterator i = in.header().begin();
         i != in.header().end();
         ++i)
    {
        if (strcmp (i.name(), "tiles"))
            hdr.insert (i.name(), i.attribute());
    }
}